

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resolve.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  undefined1 local_68 [8];
  addrinfo hints;
  addrinfo *ai;
  curl_socket_t s;
  int rc;
  char *host;
  int arg;
  char **argv_local;
  int argc_local;
  
  host._4_4_ = 1;
  _s = (char *)0x0;
  ai._4_4_ = 0;
  while( true ) {
    if (argc <= host._4_4_) {
      if (_s == (char *)0x0) {
        puts("Usage: resolve [option] <host>\n --version\n --ipv4\n --ipv6");
        argv_local._4_4_ = 1;
      }
      else {
        if ((use_ipv6 & 1U) != 0) {
          iVar1 = socket(10,2,0);
          if (iVar1 == -1) {
            ai._4_4_ = -1;
          }
          else {
            close(iVar1);
          }
        }
        if (ai._4_4_ == 0) {
          memset(local_68,0,0x30);
          local_68._4_4_ = 2;
          if ((use_ipv6 & 1U) != 0) {
            local_68._4_4_ = 10;
          }
          hints.ai_flags = 1;
          local_68._0_4_ = 2;
          ai._4_4_ = getaddrinfo(_s,"80",(addrinfo *)local_68,(addrinfo **)&hints.ai_next);
          if (ai._4_4_ == 0) {
            freeaddrinfo((addrinfo *)hints.ai_next);
          }
        }
        if (ai._4_4_ != 0) {
          curl_mprintf("Resolving %s \'%s\' didn\'t work\n",ipv_inuse,_s);
        }
        argv_local._4_4_ = (uint)(ai._4_4_ != 0);
      }
      return argv_local._4_4_;
    }
    iVar1 = strcmp("--version",argv[host._4_4_]);
    if (iVar1 == 0) break;
    iVar1 = strcmp("--ipv6",argv[host._4_4_]);
    if (iVar1 == 0) {
      ipv_inuse = "IPv6";
      use_ipv6 = true;
    }
    else {
      iVar1 = strcmp("--ipv4",argv[host._4_4_]);
      if (iVar1 == 0) {
        ipv_inuse = "IPv4";
        use_ipv6 = false;
      }
      else {
        _s = argv[host._4_4_];
      }
    }
    host._4_4_ = host._4_4_ + 1;
  }
  curl_mprintf("resolve IPv4%s\n","/IPv6");
  return 0;
}

Assistant:

int main(int argc, char *argv[])
{
  int arg = 1;
  const char *host = NULL;
  int rc = 0;

  while(argc>arg) {
    if(!strcmp("--version", argv[arg])) {
      printf("resolve IPv4%s\n",
#ifdef ENABLE_IPV6
             "/IPv6"
#else
             ""
#endif
             );
      return 0;
    }
    else if(!strcmp("--ipv6", argv[arg])) {
      ipv_inuse = "IPv6";
      use_ipv6 = TRUE;
      arg++;
    }
    else if(!strcmp("--ipv4", argv[arg])) {
      /* for completeness, we support this option as well */
      ipv_inuse = "IPv4";
      use_ipv6 = FALSE;
      arg++;
    }
    else {
      host = argv[arg++];
    }
  }
  if(!host) {
    puts("Usage: resolve [option] <host>\n"
         " --version\n"
         " --ipv4"
#ifdef ENABLE_IPV6
         "\n --ipv6"
#endif
         );
    return 1;
  }

#ifdef WIN32
  win32_init();
  atexit(win32_cleanup);
#endif

#ifdef ENABLE_IPV6
  if(use_ipv6) {
    /* Check that the system has IPv6 enabled before checking the resolver */
    curl_socket_t s = socket(PF_INET6, SOCK_DGRAM, 0);
    if(s == CURL_SOCKET_BAD)
      /* an IPv6 address was requested and we can't get/use one */
      rc = -1;
    else {
      sclose(s);
    }
  }

  if(rc == 0) {
    /* getaddrinfo() resolve */
    struct addrinfo *ai;
    struct addrinfo hints;

    memset(&hints, 0, sizeof(hints));
    hints.ai_family = use_ipv6 ? PF_INET6 : PF_INET;
    hints.ai_socktype = SOCK_STREAM;
    hints.ai_flags = AI_CANONNAME;
    /* Use parenthesis around functions to stop them from being replaced by
       the macro in memdebug.h */
    rc = (getaddrinfo)(host, "80", &hints, &ai);
    if(rc == 0)
      (freeaddrinfo)(ai);
  }
#else
  if(use_ipv6) {
    puts("IPv6 support has been disabled in this program");
    return 1;
  }
  else {
    /* gethostbyname() resolve */
    struct hostent *he;

    he = gethostbyname(host);

    rc = !he;
  }
#endif

  if(rc)
    printf("Resolving %s '%s' didn't work\n", ipv_inuse, host);

  return !!rc;
}